

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int selectExpander(Walker *pWalker,Select *p)

{
  ushort uVar1;
  uint uVar2;
  Parse *pParse_00;
  sqlite3 *db_00;
  SrcList *pList;
  ExprList *pList_00;
  ExprList_item *pEVar3;
  ExprList_item *pEVar4;
  bool bVar5;
  int iVar6;
  Db *pDVar7;
  char *pcVar8;
  Table *pTable;
  Select *pSVar9;
  Expr *pEVar10;
  char *local_120;
  bool local_111;
  ExprList_item *pX;
  Expr *pLeft;
  Token sColname;
  char *zToFree;
  char *zColname;
  char *zName;
  char *pcStack_d0;
  int iDb;
  char *zSchemaName;
  char *zTabName;
  Select *pSub;
  Table *pTab_1;
  char *zTName;
  int tableSeen;
  int longNames;
  int flags;
  ExprList *pNew;
  ExprList_item *a;
  Select *pSel;
  Table *pTab;
  Expr *pEStack_70;
  u16 selFlags;
  Expr *pExpr;
  Expr *pRight;
  Expr *pE;
  sqlite3 *db;
  SrcList_item *pFrom;
  ExprList *pEList;
  SrcList *pTabList;
  int local_30;
  int k;
  int j;
  int i;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  pParse_00 = pWalker->pParse;
  db_00 = pParse_00->db;
  uVar1 = p->selFlags;
  p->selFlags = p->selFlags | 0x10;
  if (db_00->mallocFailed == '\0') {
    if ((p->pSrc == (SrcList *)0x0) || ((uVar1 & 0x10) != 0)) {
      pWalker_local._4_4_ = 1;
    }
    else {
      pList = p->pSrc;
      pList_00 = p->pEList;
      sqlite3SrcListAssignCursors(pParse_00,pList);
      db = (sqlite3 *)pList->a;
      for (k = 0; k < pList->nSrc; k = k + 1) {
        if (db->aDb != (Db *)0x0) {
          return 1;
        }
        if (db->pDfltColl == (CollSeq *)0x0) {
          a = *(ExprList_item **)&db->nDb;
          sqlite3WalkSelect(pWalker,(Select *)a);
          pDVar7 = (Db *)sqlite3DbMallocZero(db_00,0x78);
          db->aDb = pDVar7;
          if (pDVar7 == (Db *)0x0) {
            return 2;
          }
          *(undefined2 *)((long)&pDVar7[2].zName + 4) = 1;
          pcVar8 = sqlite3MPrintf(db_00,"sqlite_subquery_%p_",pDVar7);
          pDVar7->zName = pcVar8;
          for (; a[2].zSpan != (char *)0x0; a = (ExprList_item *)a[2].zSpan) {
          }
          selectColumnsFromExprList
                    (pParse_00,(ExprList *)a->pExpr,(i16 *)((long)&pDVar7[2].zName + 2),
                     (Column **)&pDVar7->pBt);
          *(undefined2 *)&pDVar7[2].zName = 0xffff;
          *(undefined4 *)&pDVar7[1].pSchema = 1000000;
          *(byte *)((long)&pDVar7[2].zName + 6) = *(byte *)((long)&pDVar7[2].zName + 6) | 2;
        }
        else {
          pTable = sqlite3LocateTableItem(pParse_00,0,(SrcList_item *)db);
          db->aDb = (Db *)pTable;
          if (pTable == (Table *)0x0) {
            return 2;
          }
          if (pTable->nRef == 0xffff) {
            sqlite3ErrorMsg(pParse_00,"too many references to \"%s\": max 65535",pTable->zName);
            db->aDb = (Db *)0x0;
            return 2;
          }
          pTable->nRef = pTable->nRef + 1;
          if ((pTable->pSelect != (Select *)0x0) || ((pTable->tabFlags & 0x10) != 0)) {
            iVar6 = sqlite3ViewGetColumnNames(pParse_00,pTable);
            if (iVar6 != 0) {
              return 2;
            }
            pSVar9 = sqlite3SelectDup(db_00,pTable->pSelect,0);
            *(Select **)&db->nDb = pSVar9;
            sqlite3WalkSelect(pWalker,*(Select **)&db->nDb);
          }
        }
        iVar6 = sqlite3IndexedByLookup(pParse_00,(SrcList_item *)db);
        if (iVar6 != 0) {
          return 2;
        }
        db = (sqlite3 *)db->aLimit;
      }
      if ((db_00->mallocFailed == '\0') && (iVar6 = sqliteProcessJoin(pParse_00,p), iVar6 == 0)) {
        pTabList._4_4_ = 0;
        while (((pTabList._4_4_ < pList_00->nExpr &&
                (pEVar10 = pList_00->a[pTabList._4_4_].pExpr, pEVar10->op != 'q')) &&
               ((pEVar10->op != 'v' || (pEVar10->pRight->op != 'q'))))) {
          pTabList._4_4_ = pTabList._4_4_ + 1;
        }
        if (pTabList._4_4_ < pList_00->nExpr) {
          pEVar3 = pList_00->a;
          _longNames = (ExprList *)0x0;
          uVar2 = pParse_00->db->flags;
          local_111 = (uVar2 & 4) != 0 && (uVar2 & 8) == 0;
          for (pTabList._4_4_ = 0; pTabList._4_4_ < pList_00->nExpr;
              pTabList._4_4_ = pTabList._4_4_ + 1) {
            pEVar10 = pEVar3[pTabList._4_4_].pExpr;
            if ((pEVar10->op == 'q') || ((pEVar10->op == 'v' && (pEVar10->pRight->op == 'q')))) {
              bVar5 = false;
              pTab_1 = (Table *)0x0;
              if (pEVar10->op == 'v') {
                pTab_1 = (Table *)(pEVar10->pLeft->u).zToken;
              }
              db = (sqlite3 *)pList->a;
              for (k = 0; k < pList->nSrc; k = k + 1) {
                pDVar7 = db->aDb;
                zTabName = *(char **)&db->nDb;
                zSchemaName = (char *)db->mutex;
                pcStack_d0 = (char *)0x0;
                if ((sqlite3_mutex *)zSchemaName == (sqlite3_mutex *)0x0) {
                  zSchemaName = pDVar7->zName;
                }
                if (db_00->mallocFailed != '\0') break;
                if ((zTabName == (char *)0x0) || ((*(ushort *)(zTabName + 10) & 0x200) == 0)) {
                  zTabName = (char *)0x0;
                  if ((pTab_1 == (Table *)0x0) ||
                     (iVar6 = sqlite3_stricmp((char *)pTab_1,zSchemaName), iVar6 == 0)) {
                    iVar6 = sqlite3SchemaToIndex(db_00,(Schema *)pDVar7[3].pBt);
                    if (iVar6 < 0) {
                      local_120 = "*";
                    }
                    else {
                      local_120 = db_00->aDb[iVar6].zName;
                    }
                    pcStack_d0 = local_120;
                    goto LAB_00186097;
                  }
                }
                else {
LAB_00186097:
                  for (local_30 = 0; local_30 < *(short *)((long)&pDVar7[2].zName + 2);
                      local_30 = local_30 + 1) {
                    zToFree = (char *)(&pDVar7->pBt->db)[(long)local_30 * 6];
                    if (((((pTab_1 == (Table *)0x0) || (zTabName == (char *)0x0)) ||
                         (iVar6 = sqlite3MatchSpanName
                                            (*(char **)(*(long *)(*(long *)zTabName + 8) +
                                                        (long)local_30 * 0x20 + 0x10),(char *)0x0,
                                             (char *)pTab_1,(char *)0x0), iVar6 != 0)) &&
                        ((*(ushort *)((long)&pDVar7->pBt->pPrev + (long)local_30 * 0x30 + 2) & 2) ==
                         0)) && (((bVar5 = true, k < 1 || (pTab_1 != (Table *)0x0)) ||
                                 ((((db->szMmap & 4) == 0 ||
                                   (iVar6 = tableAndColumnIndex(pList,k,zToFree,(int *)0x0,
                                                                (int *)0x0), iVar6 == 0)) &&
                                  (iVar6 = sqlite3IdListIndex(*(IdList **)&db->errMask,zToFree),
                                  iVar6 < 0)))))) {
                      pEStack_70 = sqlite3Expr(db_00,0x1a,zToFree);
                      sColname.n = 0;
                      sColname._12_4_ = 0;
                      if ((local_111) || (1 < pList->nSrc)) {
                        pEVar10 = sqlite3Expr(db_00,0x1a,zSchemaName);
                        pEStack_70 = sqlite3PExpr(pParse_00,0x76,pEVar10,pEStack_70,(Token *)0x0);
                        if (pcStack_d0 != (char *)0x0) {
                          pEVar10 = sqlite3Expr(db_00,0x1a,pcStack_d0);
                          pEStack_70 = sqlite3PExpr(pParse_00,0x76,pEVar10,pEStack_70,(Token *)0x0);
                        }
                        if (local_111) {
                          sColname._8_8_ = sqlite3MPrintf(db_00,"%s.%s",zSchemaName);
                          zToFree = (char *)sColname._8_8_;
                        }
                      }
                      _longNames = sqlite3ExprListAppend(pParse_00,_longNames,pEStack_70);
                      pLeft = (Expr *)zToFree;
                      sColname.z._0_4_ = sqlite3Strlen30(zToFree);
                      sqlite3ExprListSetName(pParse_00,_longNames,(Token *)&pLeft,0);
                      if ((_longNames != (ExprList *)0x0) && ((p->selFlags & 0x200) != 0)) {
                        pEVar4 = _longNames->a;
                        iVar6 = _longNames->nExpr + -1;
                        if (zTabName == (char *)0x0) {
                          pcVar8 = sqlite3MPrintf(db_00,"%s.%s.%s",pcStack_d0,zSchemaName,zToFree);
                          pEVar4[iVar6].zSpan = pcVar8;
                        }
                        else {
                          pcVar8 = sqlite3DbStrDup(db_00,*(char **)(*(long *)(*(long *)zTabName + 8)
                                                                    + (long)local_30 * 0x20 + 0x10))
                          ;
                          pEVar4[iVar6].zSpan = pcVar8;
                        }
                        pEVar4[iVar6].field_0x19 = pEVar4[iVar6].field_0x19 & 0xfd | 2;
                      }
                      sqlite3DbFree(db_00,(void *)sColname._8_8_);
                    }
                  }
                }
                db = (sqlite3 *)db->aLimit;
              }
              if (!bVar5) {
                if (pTab_1 == (Table *)0x0) {
                  sqlite3ErrorMsg(pParse_00,"no tables specified");
                }
                else {
                  sqlite3ErrorMsg(pParse_00,"no such table: %s",pTab_1);
                }
              }
            }
            else {
              _longNames = sqlite3ExprListAppend(pParse_00,_longNames,pEVar3[pTabList._4_4_].pExpr);
              if (_longNames != (ExprList *)0x0) {
                _longNames->a[_longNames->nExpr + -1].zName = pEVar3[pTabList._4_4_].zName;
                _longNames->a[_longNames->nExpr + -1].zSpan = pEVar3[pTabList._4_4_].zSpan;
                pEVar3[pTabList._4_4_].zName = (char *)0x0;
                pEVar3[pTabList._4_4_].zSpan = (char *)0x0;
              }
              pEVar3[pTabList._4_4_].pExpr = (Expr *)0x0;
            }
          }
          sqlite3ExprListDelete(db_00,pList_00);
          p->pEList = _longNames;
        }
        if ((p->pEList != (ExprList *)0x0) && (db_00->aLimit[2] < p->pEList->nExpr)) {
          sqlite3ErrorMsg(pParse_00,"too many columns in result set");
        }
        pWalker_local._4_4_ = 0;
      }
      else {
        pWalker_local._4_4_ = 2;
      }
    }
  }
  else {
    pWalker_local._4_4_ = 2;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    if( pFrom->pTab!=0 ){
      /* This statement has already been prepared.  There is no need
      ** to go further. */
      assert( i==0 );
      return WRC_Prune;
    }
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      sqlite3WalkSelect(pWalker, pSel);
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_subquery_%p_", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      selectColumnsFromExprList(pParse, pSel->pEList, &pTab->nCol, &pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowEst = 1000000;
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nRef==0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nRef++;
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( pTab->pSelect || IsVirtual(pTab) ){
        /* We reach here if the named table is a really a view */
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ALL operator for each "*" that it found in the column list.
  ** The following code just has to locate the TK_ALL expressions and expand
  ** each one to the list of all columns in all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ALL ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ALL ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    /* When processing FROM-clause subqueries, it is always the case
    ** that full_column_names=OFF and short_column_names=ON.  The
    ** sqlite3ResultSetOfSelect() routine makes it so. */
    assert( (p->selFlags & SF_NestedFrom)==0
          || ((flags & SQLITE_FullColNames)==0 &&
              (flags & SQLITE_ShortColNames)!=0) );

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ALL && (pE->op!=TK_DOT || pRight->op!=TK_ALL) ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden' (currently only possible
            ** for virtual tables), do not include it in the expanded
            ** result-set list.
            */
            if( IsHiddenColumn(&pTab->aCol[j]) ){
              assert(IsVirtual(pTab));
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight, 0);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr, 0);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sColname.z = zColname;
            sColname.n = sqlite3Strlen30(zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
  }
#endif
  return WRC_Continue;
}